

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O3

int I420Mirror(uint8_t *src_y,int src_stride_y,uint8_t *src_u,int src_stride_u,uint8_t *src_v,
              int src_stride_v,uint8_t *dst_y,int dst_stride_y,uint8_t *dst_u,int dst_stride_u,
              uint8_t *dst_v,int dst_stride_v,int width,int height)

{
  int iVar1;
  int iVar2;
  uint height_00;
  undefined1 auVar3 [16];
  
  auVar3._0_4_ = -(uint)(src_y == (uint8_t *)0x0);
  auVar3._4_4_ = -(uint)(src_u == (uint8_t *)0x0);
  auVar3._8_4_ = -(uint)(src_v == (uint8_t *)0x0);
  auVar3._12_4_ = -(uint)(dst_u == (uint8_t *)0x0);
  iVar2 = movmskps(src_stride_u,auVar3);
  iVar1 = -1;
  if ((((iVar2 == 0) && (dst_v != (uint8_t *)0x0)) && (height != 0)) && (0 < width)) {
    if (height < 0) {
      iVar1 = -height;
      height_00 = 1U - height >> 1;
      src_y = src_y + ~height * src_stride_y;
      src_u = src_u + (int)((height_00 - 1) * src_stride_u);
      src_v = src_v + (int)((height_00 - 1) * src_stride_v);
      src_stride_y = -src_stride_y;
      src_stride_u = -src_stride_u;
      src_stride_v = -src_stride_v;
    }
    else {
      height_00 = height + 1 >> 1;
      iVar1 = height;
    }
    iVar2 = width + 1 >> 1;
    if (dst_y != (uint8_t *)0x0) {
      MirrorPlane(src_y,src_stride_y,dst_y,dst_stride_y,width,iVar1);
    }
    MirrorPlane(src_u,src_stride_u,dst_u,dst_stride_u,iVar2,height_00);
    MirrorPlane(src_v,src_stride_v,dst_v,dst_stride_v,iVar2,height_00);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

LIBYUV_API
int I420Mirror(const uint8_t* src_y,
               int src_stride_y,
               const uint8_t* src_u,
               int src_stride_u,
               const uint8_t* src_v,
               int src_stride_v,
               uint8_t* dst_y,
               int dst_stride_y,
               uint8_t* dst_u,
               int dst_stride_u,
               uint8_t* dst_v,
               int dst_stride_v,
               int width,
               int height) {
  int halfwidth = (width + 1) >> 1;
  int halfheight = (height + 1) >> 1;
  if (!src_y || !src_u || !src_v || !dst_u || !dst_v || width <= 0 ||
      height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    halfheight = (height + 1) >> 1;
    src_y = src_y + (height - 1) * src_stride_y;
    src_u = src_u + (halfheight - 1) * src_stride_u;
    src_v = src_v + (halfheight - 1) * src_stride_v;
    src_stride_y = -src_stride_y;
    src_stride_u = -src_stride_u;
    src_stride_v = -src_stride_v;
  }

  if (dst_y) {
    MirrorPlane(src_y, src_stride_y, dst_y, dst_stride_y, width, height);
  }
  MirrorPlane(src_u, src_stride_u, dst_u, dst_stride_u, halfwidth, halfheight);
  MirrorPlane(src_v, src_stride_v, dst_v, dst_stride_v, halfwidth, halfheight);
  return 0;
}